

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_Decrypt(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
                  CK_ULONG ulEncryptedDataLen,CK_BYTE_PTR pData,CK_ULONG_PTR pulDataLen)

{
  int iVar1;
  Session *this_00;
  SymmetricAlgorithm *pSVar2;
  long in_RDX;
  long in_RDI;
  long in_R9;
  CK_SESSION_HANDLE unaff_retaddr;
  Session *session;
  CK_ULONG_PTR in_stack_00000068;
  CK_BYTE_PTR in_stack_00000070;
  CK_ULONG in_stack_00000078;
  CK_BYTE_PTR in_stack_00000080;
  Session *in_stack_00000088;
  CK_BYTE_PTR in_stack_00000090;
  CK_ULONG in_stack_00000098;
  CK_BYTE_PTR in_stack_000000a0;
  Session *in_stack_000000a8;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else {
    this_00 = (Session *)HandleManager::getSession((HandleManager *)session,unaff_retaddr);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else if ((in_RDX == 0) || (in_R9 == 0)) {
      Session::resetOp(this_00);
      local_8 = 7;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 3) {
        pSVar2 = Session::getSymmetricCryptoOp(this_00);
        if (pSVar2 == (SymmetricAlgorithm *)0x0) {
          local_8 = AsymDecrypt(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                in_stack_00000070,in_stack_00000068);
        }
        else {
          local_8 = SymDecrypt(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                               in_stack_00000090,(CK_ULONG_PTR)in_stack_00000088);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_Decrypt(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG ulEncryptedDataLen, CK_BYTE_PTR pData, CK_ULONG_PTR pulDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pEncryptedData == NULL_PTR) || (pulDataLen == NULL_PTR))
	{
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DECRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				  pData, pulDataLen);
	else
		return AsymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				   pData, pulDataLen);
}